

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

size_t roaring_bitmap_serialize(roaring_bitmap_t *r,char *buf)

{
  size_t sVar1;
  uint64_t uVar2;
  
  sVar1 = ra_portable_size_in_bytes(&r->high_low_container);
  uVar2 = roaring_bitmap_get_cardinality(r);
  if (sVar1 < uVar2 * 4 + 4) {
    *buf = '\x02';
    sVar1 = ra_portable_serialize(&r->high_low_container,buf + 1);
    sVar1 = sVar1 + 1;
  }
  else {
    *buf = '\x01';
    *(int *)(buf + 1) = (int)uVar2;
    ra_to_uint32_array(&r->high_low_container,(uint32_t *)(buf + 5));
    sVar1 = uVar2 * 4 + 5;
  }
  return sVar1;
}

Assistant:

size_t roaring_bitmap_serialize(const roaring_bitmap_t *r, char *buf) {
    size_t portablesize = roaring_bitmap_portable_size_in_bytes(r);
    uint64_t cardinality = roaring_bitmap_get_cardinality(r);
    uint64_t sizeasarray = cardinality * sizeof(uint32_t) + sizeof(uint32_t);
    if (portablesize < sizeasarray) {
        buf[0] = SERIALIZATION_CONTAINER;
        return roaring_bitmap_portable_serialize(r, buf + 1) + 1;
    } else {
        buf[0] = SERIALIZATION_ARRAY_UINT32;
        memcpy(buf + 1, &cardinality, sizeof(uint32_t));
        roaring_bitmap_to_uint32_array(
            r, (uint32_t *)(buf + 1 + sizeof(uint32_t)));
        return 1 + (size_t)sizeasarray;
    }
}